

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dti.cpp
# Opt level: O0

bool ReadDTI(MemFile *file,shared_ptr<Disk> *disk)

{
  byte bVar1;
  uint8_t uVar2;
  int size_;
  ulong uVar3;
  exception *peVar4;
  uint8_t *puVar5;
  byte *pbVar6;
  element_type *peVar7;
  size_t in_RCX;
  long lVar8;
  size_t sVar9;
  allocator<unsigned_char> local_101;
  undefined1 local_100 [8];
  Data data;
  undefined1 local_d8 [8];
  Sector sector;
  undefined1 local_90 [7];
  bool bad_data_crc;
  Track track;
  int uDataLen;
  uint8_t flags;
  CylHead cylhead;
  uint8_t cyl;
  uint8_t head;
  MEMORY mem;
  uint local_2c;
  int local_28;
  int uBlock;
  DTI_HEADER dh;
  shared_ptr<Disk> *disk_local;
  MemFile *file_local;
  
  dh = (DTI_HEADER)disk;
  MemFile::rewind(file,(FILE *)disk);
  uVar3 = MemFile::read(file,(int)&local_28,(void *)0x8,in_RCX);
  if (((uVar3 & 1) == 0) || (local_28 != 0x32473248)) {
    file_local._7_1_ = false;
  }
  else {
    Format::Validate((uint)(byte)uBlock,(uint)uBlock._1_1_,1,0x200,0);
    local_2c = (uint)uBlock._2_2_;
    if (local_2c != 0x900) {
      peVar4 = (exception *)__cxa_allocate_exception(0x10);
      util::exception::exception<char_const(&)[31],int&,char_const(&)[2]>
                (peVar4,(char (*) [31])"unsupported track block size (",(int *)&local_2c,
                 (char (*) [2])0x2a8e34);
      __cxa_throw(peVar4,&util::exception::typeinfo,util::exception::~exception);
    }
    MEMORY::MEMORY((MEMORY *)&cylhead.head,0x900);
    for (cylhead.cyl._3_1_ = 0; cylhead.cyl._3_1_ < uBlock._1_1_;
        cylhead.cyl._3_1_ = cylhead.cyl._3_1_ + 1) {
      for (cylhead.cyl._2_1_ = 0; sVar9 = (size_t)(byte)uBlock, cylhead.cyl._2_1_ < (byte)uBlock;
          cylhead.cyl._2_1_ = cylhead.cyl._2_1_ + 1) {
        CylHead::CylHead((CylHead *)&uDataLen,(uint)cylhead.cyl._2_1_,(uint)cylhead.cyl._3_1_);
        puVar5 = MEMORY::operator_cast_to_unsigned_char_((MEMORY *)&cylhead.head);
        uVar3 = MemFile::read(file,(int)puVar5,(void *)(ulong)local_2c,sVar9);
        if ((uVar3 & 1) == 0) {
          peVar4 = (exception *)__cxa_allocate_exception(0x10);
          util::exception::exception<char_const(&)[22],CylHead&>
                    (peVar4,(char (*) [22])"short file reading %s",(CylHead *)&uDataLen);
          __cxa_throw(peVar4,&util::exception::typeinfo,util::exception::~exception);
        }
        pbVar6 = MEMORY::operator_cast_to_unsigned_char_((MEMORY *)&cylhead.head);
        bVar1 = *pbVar6;
        puVar5 = MEMORY::operator_cast_to_unsigned_char_((MEMORY *)&cylhead.head);
        uVar2 = puVar5[2];
        puVar5 = MEMORY::operator_cast_to_unsigned_char_((MEMORY *)&cylhead.head);
        track.m_sectors.super__Vector_base<Sector,_std::allocator<Sector>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._4_4_ = (uint)CONCAT11(uVar2,puVar5[1]);
        sVar9 = (size_t)(local_2c - 3);
        if ((int)(local_2c - 3) <
            (int)track.m_sectors.super__Vector_base<Sector,_std::allocator<Sector>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage._4_4_) {
          peVar4 = (exception *)__cxa_allocate_exception(0x10);
          util::exception::exception<char_const(&)[22],int&,char_const(&)[6],CylHead&>
                    (peVar4,(char (*) [22])"invalid data length (",
                     (int *)((long)&track.m_sectors.
                                    super__Vector_base<Sector,_std::allocator<Sector>_>._M_impl.
                                    super__Vector_impl_data._M_end_of_storage + 4),
                     (char (*) [6])") on ",(CylHead *)&uDataLen);
          __cxa_throw(peVar4,&util::exception::typeinfo,util::exception::~exception);
        }
        Track::Track((Track *)local_90,1);
        if (track.m_sectors.super__Vector_base<Sector,_std::allocator<Sector>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage._4_4_ != 0) {
          sector.m_data.super__Vector_base<Data,_std::allocator<Data>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._7_1_ = bVar1 & 1;
          size_ = SizeToCode(0x1000);
          Header::Header((Header *)
                         &data.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage,(CylHead *)&uDataLen,0,size_);
          Sector::Sector((Sector *)local_d8,_250K,Ace,
                         (Header *)
                         &data.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage,0);
          lVar8 = (long)(int)track.m_sectors.super__Vector_base<Sector,_std::allocator<Sector>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
          std::allocator<unsigned_char>::allocator(&local_101);
          Data::vector<unsigned_char*,void>
                    ((Data *)local_100,(uchar *)(mem._8_8_ + 2),(uchar *)(mem._8_8_ + 2 + lVar8),
                     &local_101);
          std::allocator<unsigned_char>::~allocator(&local_101);
          sVar9 = 0xfb;
          Sector::add((Sector *)local_d8,(Data *)local_100,
                      (bool)(sector.m_data.super__Vector_base<Data,_std::allocator<Data>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage._7_1_ & 1),0xfb);
          Track::add((Track *)local_90,(Sector *)local_d8);
          Data::~Data((Data *)local_100);
          Sector::~Sector((Sector *)local_d8);
        }
        peVar7 = std::__shared_ptr_access<Disk,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<Disk,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                            dh);
        Disk::write(peVar7,(int)&uDataLen,local_90,sVar9);
        Track::~Track((Track *)local_90);
      }
    }
    peVar7 = std::__shared_ptr_access<Disk,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       ((__shared_ptr_access<Disk,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)dh);
    std::__cxx11::string::operator=((string *)&peVar7->strType,"DTI");
    file_local._7_1_ = true;
    MEMORY::~MEMORY((MEMORY *)&cylhead.head);
  }
  return file_local._7_1_;
}

Assistant:

bool ReadDTI(MemFile& file, std::shared_ptr<Disk>& disk)
{
    file.rewind();

    DTI_HEADER dh;
    if (!file.read(&dh, sizeof(dh)) || memcmp(dh.abSignature, DTI_SIGNATURE, sizeof(dh.abSignature)))
        return false;

    Format::Validate(dh.bTracks, dh.bSides);

    auto uBlock = (dh.bBlockHigh << 8) | dh.bBlockLow;
    if (uBlock != DTI_BLOCK_SIZE)
        throw util::exception("unsupported track block size (", uBlock, ")");

    MEMORY mem(uBlock);

    for (uint8_t head = 0; head < dh.bSides; head++)
    {
        for (uint8_t cyl = 0; cyl < dh.bTracks; cyl++)
        {
            CylHead cylhead(cyl, head);

            if (!file.read(mem, uBlock))
                throw util::exception("short file reading %s", cylhead);

            uint8_t flags = mem[0];
            auto uDataLen = (mem[2] << 8) | mem[1];
            if (uDataLen > uBlock - static_cast<int>(sizeof(DTI_TRACK)))
                throw util::exception("invalid data length (", uDataLen, ") on ", cylhead);

            Track track(1);
            if (uDataLen)
            {
                bool bad_data_crc = (flags & 1) != 0;
                Sector sector(DataRate::_250K, Encoding::Ace, Header(cylhead, 0, SizeToCode(4096)));
                Data data(mem.pb + 2, mem.pb + 2 + uDataLen);
                sector.add(std::move(data), bad_data_crc);
                track.add(std::move(sector));
            }

            disk->write(cylhead, std::move(track));
        }
    }

    disk->strType = "DTI";
    return true;
}